

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

Vector * __thiscall duckdb::ConflictManager::InternalIntermediate(ConflictManager *this)

{
  pointer __p;
  type pVVar1;
  bool local_1a;
  bool local_19;
  pointer local_18;
  
  if ((this->intermediate_vector).
      super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    local_19 = true;
    local_1a = true;
    make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,bool,bool,unsigned_long&>
              ((duckdb *)&local_18,&LogicalType::BOOLEAN,&local_19,&local_1a,&this->input_size);
    __p = local_18;
    local_18 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
              ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
               &this->intermediate_vector,__p);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_18);
  }
  pVVar1 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&this->intermediate_vector);
  return pVVar1;
}

Assistant:

Vector &ConflictManager::InternalIntermediate() {
	if (!intermediate_vector) {
		intermediate_vector = make_uniq<Vector>(LogicalType::BOOLEAN, true, true, input_size);
	}
	return *intermediate_vector;
}